

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_read.c
# Opt level: O1

void data_sheet_expat_callback_find_row_start(void *callbackdata,XML_Char *name,XML_Char **atts)

{
  int iVar1;
  XML_Char *__nptr;
  long lVar2;
  byte bVar3;
  
  iVar1 = XML_Char_icmp_ins(name,"row");
  if (iVar1 == 0) {
    __nptr = get_expat_attr_by_name(atts,"hidden");
    if (__nptr != (XML_Char *)0x0) {
      lVar2 = strtol(__nptr,(char **)0x0,10);
      if ((lVar2 != 0) && ((*(byte *)((long)callbackdata + 0x44) & 8) != 0)) {
        XML_SetElementHandler(*callbackdata,0,data_sheet_expat_callback_find_row_end);
        return;
      }
    }
    if ((*(long *)((long)callbackdata + 0x10) == 0) || (*(long *)((long)callbackdata + 0x28) != 0))
    {
      bVar3 = 0;
    }
    else {
      bVar3 = *(byte *)((long)callbackdata + 0x44) & 1;
    }
    *(long *)((long)callbackdata + 0x10) = *(long *)((long)callbackdata + 0x10) + 1;
    *(undefined8 *)((long)callbackdata + 0x18) = 0;
    *(undefined8 *)((long)callbackdata + 0x28) = 0;
    XML_SetElementHandler
              (*callbackdata,data_sheet_expat_callback_find_cell_start,
               data_sheet_expat_callback_find_row_end);
    if (((*(byte *)((long)callbackdata + 0x44) & 0x80) != 0) && (bVar3 == 0)) {
      XML_StopParser(*callbackdata,1);
      return;
    }
  }
  return;
}

Assistant:

void data_sheet_expat_callback_find_row_start (void* callbackdata, const XML_Char* name, const XML_Char** atts)
{
  struct data_sheet_callback_data* data = (struct data_sheet_callback_data*)callbackdata;
  if (XML_Char_icmp_ins(name, X("row")) == 0) {
    const XML_Char* hidden = get_expat_attr_by_name(atts, X("hidden"));
    if (!(hidden && XML_Char_tol(hidden) != 0 && (data->flags & XLSXIOREAD_SKIP_HIDDEN_ROWS))) {
      int skippedemptyrow = (data->rownr != 0 && data->colsnotnull == 0 && (data->flags & XLSXIOREAD_SKIP_EMPTY_ROWS));
      data->rownr++;
      data->colnr = 0;
      data->colsnotnull = 0;
      XML_SetElementHandler(data->xmlparser, data_sheet_expat_callback_find_cell_start, data_sheet_expat_callback_find_row_end);
      //for non-calback method suspend here on new row
      if (data->flags & XLSXIOREAD_NO_CALLBACK) {
        if (!skippedemptyrow) {
          XML_StopParser(data->xmlparser, XML_TRUE);
        }
      }
    } else {
      //skip hidden row
      XML_SetElementHandler(data->xmlparser, NULL, data_sheet_expat_callback_find_row_end);
    }
  }
}